

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O2

void time_pcounter_nv40(uint cnum)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  
  puts("Perf counters:");
  uVar2 = *(uint *)((long)nva_cards[(int)cnum]->bar0 + 0x400084) | 0x20;
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    pvVar1 = nva_cards[(int)cnum]->bar0;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa7c0) = 1;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa460) = 0;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa4a0) = 0;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa4e0) = 0;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa500) = 0;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa520) = 0;
    *(undefined4 *)((long)pvVar1 + uVar3 * 4 + 0xa420) = 0xffff;
    *(uint *)((long)pvVar1 + 0x400084) = uVar2;
    sleep(1);
    pvVar1 = nva_cards[(int)cnum]->bar0;
    *(uint *)((long)pvVar1 + 0x400084) = uVar2;
    printf("Set %d: %u Hz\n",uVar3 & 0xffffffff,(ulong)*(uint *)((long)pvVar1 + uVar3 * 4 + 0xa600))
    ;
  }
  return;
}

Assistant:

void time_pcounter_nv40(unsigned int cnum)
{
	printf ("Perf counters:\n");

	int i;
	uint32_t debug1 = nva_rd32(cnum, 0x400084);
	for (i = 0; i < 8; i++) {
		nva_wr32(cnum, 0xa7c0 + i * 4, 0x1);
		nva_wr32(cnum, 0xa460 + i * 4, 0);
		nva_wr32(cnum, 0xa4a0 + i * 4, 0);
		nva_wr32(cnum, 0xa4e0 + i * 4, 0);
		nva_wr32(cnum, 0xa500 + i * 4, 0);
		nva_wr32(cnum, 0xa520 + i * 4, 0);
		nva_wr32(cnum, 0xa420 + i * 4, 0xffff);
		nva_wr32(cnum, 0x400084, debug1 | 0x20);
		sleep(1);
		nva_wr32(cnum, 0x400084, debug1 | 0x20);
		printf ("Set %d: %u Hz\n", i, nva_rd32(cnum, 0xa600 + i * 4));
	}
}